

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

void MAFSA_automaton_enumerate
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               void *user_data,MAFSA_automaton_string_handler fetcher)

{
  ulong uVar1;
  MAFSA_letter MVar2;
  uint uVar3;
  uint cstate;
  size_t sVar4;
  uint uVar5;
  MAFSA_stack_struct local_40;
  
  cstate = *ma->ptr_nodes;
  sVar4 = 0;
  local_40.current = 0xffffffffffffffff;
  if (sz_l != 0) {
    do {
      MVar2 = l[sVar4];
      uVar1 = local_40.current + 1;
      if (uVar1 < sz_tmp) {
        tmp[uVar1] = MVar2;
        local_40.current = uVar1;
      }
      uVar5 = cstate & 0x7fffffff;
      uVar3 = ma->ptr_links[uVar5];
      while( true ) {
        if (uVar3 == 0xff000000) goto LAB_00101973;
        uVar5 = uVar5 + 1;
        if (MVar2 == (MAFSA_letter)(uVar3 >> 0x18)) break;
        uVar3 = ma->ptr_links[uVar5];
      }
      if ((uVar3 & 0xffffff) == 0) break;
      cstate = ma->ptr_nodes[uVar3 & 0xffffff];
      sVar4 = (size_t)((int)sVar4 + 1);
    } while (sVar4 < sz_l);
  }
LAB_00101973:
  if ((l == (MAFSA_letter *)0x0) || (sVar4 == sz_l)) {
    local_40.buffer = tmp;
    local_40.reserved = sz_tmp;
    enumerate(ma,cstate,&local_40,fetcher,user_data);
  }
  return;
}

Assistant:

extern void MAFSA_automaton_enumerate(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, void *user_data, MAFSA_automaton_string_handler fetcher)
{
    uint32_t i;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 1;

    struct MAFSA_stack_struct tmp_stack;

    tmp_stack.buffer   = tmp;
    tmp_stack.reserved = sz_tmp;
    tmp_stack.current  = -1;

    for (i = 0; i < sz_l; ++i)
    {
        MAFSA_letter label = l[i];
        stack_push(&tmp_stack, label);

        if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if ((i == sz_l && where) || 0 == l)
    {
        enumerate(ma, current, &tmp_stack, fetcher, user_data);
    }
}